

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O1

ssize_t Curl_bufq_read(bufq *q,uchar *buf,size_t len,CURLcode *err)

{
  buf_chunk *pbVar1;
  size_t *psVar2;
  ulong __n;
  void *__src;
  ssize_t sVar3;
  
  *err = CURLE_OK;
  if (len == 0) {
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
    do {
      pbVar1 = q->head;
      if (pbVar1 == (buf_chunk *)0x0) break;
      __n = pbVar1->w_offset - pbVar1->r_offset;
      if (__n == 0) {
        __n = 0;
      }
      else {
        __src = (void *)((long)&pbVar1->x + pbVar1->r_offset);
        psVar2 = &pbVar1->r_offset;
        if (len < __n) {
          memcpy(buf,__src,len);
          *psVar2 = *psVar2 + len;
          __n = len;
        }
        else {
          memcpy(buf,__src,__n);
          *psVar2 = 0;
          pbVar1->w_offset = 0;
        }
      }
      sVar3 = sVar3 + __n;
      buf = buf + __n;
      prune_head(q);
      len = len - __n;
    } while (len != 0);
  }
  if (sVar3 == 0) {
    *err = CURLE_AGAIN;
    sVar3 = -1;
  }
  return sVar3;
}

Assistant:

ssize_t Curl_bufq_read(struct bufq *q, unsigned char *buf, size_t len,
                       CURLcode *err)
{
  ssize_t nread = 0;
  size_t n;

  *err = CURLE_OK;
  while(len && q->head) {
    n = chunk_read(q->head, buf, len);
    if(n) {
      nread += n;
      buf += n;
      len -= n;
    }
    prune_head(q);
  }
  if(nread == 0) {
    *err = CURLE_AGAIN;
    return -1;
  }
  return nread;
}